

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Appearance_PDU.cpp
# Opt level: O2

KBOOL __thiscall KDIS::PDU::Appearance_PDU::operator==(Appearance_PDU *this,Appearance_PDU *Value)

{
  KBOOL KVar1;
  
  KVar1 = LE_Header::operator!=(&this->super_LE_Header,&Value->super_LE_Header);
  if ((((((!KVar1) &&
         ((this->m_AppearanceFlag1Union).m_ui8Flag == (Value->m_AppearanceFlag1Union).m_ui8Flag)) &&
        ((this->m_AppearanceFlag2Union).m_ui8Flag == (Value->m_AppearanceFlag2Union).m_ui8Flag)) &&
       ((this->m_ui8ForceID == Value->m_ui8ForceID &&
        (KVar1 = DATA_TYPE::EntityType::operator!=(&this->m_EntityType,&Value->m_EntityType), !KVar1
        )))) && ((KVar1 = DATA_TYPE::EntityType::operator!=
                                    (&this->m_AltEntityType,&Value->m_AltEntityType), !KVar1 &&
                 ((KVar1 = DATA_TYPE::EntityMarking::operator!=
                                     (&this->m_EntityMarking,&Value->m_EntityMarking), !KVar1 &&
                  (KVar1 = DATA_TYPE::EntityCapabilities::operator!=
                                     (&this->m_EntityCapabilities,&Value->m_EntityCapabilities),
                  !KVar1)))))) &&
     ((KVar1 = DATA_TYPE::EntityAppearance::operator!=(&this->m_VisApp,&Value->m_VisApp), !KVar1 &&
      ((KVar1 = DATA_TYPE::EntityAppearance::operator!=(&this->m_IRApp,&Value->m_IRApp), !KVar1 &&
       (KVar1 = DATA_TYPE::EntityAppearance::operator!=(&this->m_EMApp,&Value->m_EMApp), !KVar1)))))
     ) {
    KVar1 = DATA_TYPE::EntityAppearance::operator!=(&this->m_AudApp,&Value->m_AudApp);
    return !KVar1;
  }
  return false;
}

Assistant:

KBOOL Appearance_PDU::operator == ( const Appearance_PDU & Value ) const
{
    if( LE_Header::operator              != ( Value ) )                              return false;
    if( m_AppearanceFlag1Union.m_ui8Flag != Value.m_AppearanceFlag1Union.m_ui8Flag ) return false;
    if( m_AppearanceFlag2Union.m_ui8Flag != Value.m_AppearanceFlag2Union.m_ui8Flag ) return false;
    if( m_ui8ForceID                     != Value.m_ui8ForceID )                     return false;
    if( m_EntityType                     != Value.m_EntityType )                     return false;
    if( m_AltEntityType                  != Value.m_AltEntityType )                  return false;
    if( m_EntityMarking                  != Value.m_EntityMarking )                  return false;
    if( m_EntityCapabilities             != Value.m_EntityCapabilities )             return false;
    if( m_VisApp                         != Value.m_VisApp )                         return false;
    if( m_IRApp                          != Value.m_IRApp )                          return false;
    if( m_EMApp                          != Value.m_EMApp )                          return false;
    if( m_AudApp                         != Value.m_AudApp )                         return false;
    return true;
}